

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRules
          (Compilation *this,string_view lookupName,Scope *scope,ResolvedConfig *parentConfig,
          ConfigRule *rule,
          vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList)

{
  undefined7 uVar1;
  bool bVar2;
  pointer ppVar3;
  span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *psVar4;
  reference ppSVar5;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *ppVar6;
  SourceLibrary *in_RSI;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *in_RDI;
  Scope *in_R8;
  long in_R9;
  ConfigRule *in_stack_00000008;
  ConfigRule *in_stack_00000040;
  Scope *in_stack_00000048;
  Compilation *in_stack_00000050;
  optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> result_1;
  DefinitionSymbol *parentDef;
  optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> result;
  SourceLibrary *lib;
  iterator __end3;
  iterator __begin3;
  span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *__range3;
  anon_class_40_5_c3c3317d findDefWithOverride;
  CellId *id;
  const_iterator overrideIt;
  flat_hash_map<std::string_view,_CellOverride> *overrides;
  ConfigBlockSymbol *conf;
  span<const_slang::SourceLibrary_*const,_18446744073709551615UL> liblist;
  CellOverride *cellOverride;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd88;
  Compilation *in_stack_fffffffffffffd90;
  SourceLocation in_stack_fffffffffffffd98;
  Compilation *__y;
  SourceLocation __x;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *this_00;
  bool local_231;
  DefinitionLookupResult local_230 [2];
  DefinitionSymbol *local_1f0;
  SourceLibrary *local_1c0;
  SourceLibrary **local_1b8;
  __normal_iterator<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
  local_1b0;
  pointer *local_1a8;
  CellOverride **local_1a0;
  Scope *this_01;
  pointer local_140;
  size_t local_138;
  CellOverride *local_130;
  long local_128;
  Scope *local_120;
  undefined1 local_110 [24];
  SourceLocation local_f8;
  Scope *local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  Compilation *local_d0;
  SourceLocation local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
  local_b0;
  Compilation *local_98;
  SourceLocation local_90;
  iterator local_88;
  __extent_storage<18446744073709551615UL> local_78;
  Compilation *local_70;
  SourceLocation local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Compilation *local_10;
  SourceLocation local_8;
  
  local_130 = (CellOverride *)0x0;
  this_00 = in_RDI;
  local_128 = in_R9;
  local_120 = in_R8;
  std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::span
            ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)0x56ae0f);
  if (local_128 != 0) {
    local_140 = *(pointer *)(local_128 + 0x10);
    local_138 = *(size_t *)(local_128 + 0x18);
    in_stack_fffffffffffffd98 =
         (SourceLocation)
         ConfigBlockSymbol::getCellOverrides((ConfigBlockSymbol *)in_stack_fffffffffffffd90);
    local_110._16_8_ = local_110;
    local_f8 = in_stack_fffffffffffffd98;
    local_d0 = (Compilation *)local_110._16_8_;
    local_c8 = in_stack_fffffffffffffd98;
    local_98 = (Compilation *)local_110._16_8_;
    local_90 = in_stack_fffffffffffffd98;
    local_70 = (Compilation *)local_110._16_8_;
    local_68 = in_stack_fffffffffffffd98;
    local_78._M_extent_value =
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
         ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                   ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                     *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    __y = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                               *)in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    local_20 = local_78._M_extent_value;
    __x = in_stack_fffffffffffffd98;
    local_10 = __y;
    local_8 = in_stack_fffffffffffffd98;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                           *)0x56afa1);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                               *)0x56afec);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffd88 =
               (basic_string_view<char,_std::char_traits<char>_> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                       *)0x56b03c);
          in_stack_fffffffffffffd90 = local_10;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                      *)0x56b068);
          bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this_00,(basic_string_view<char,_std::char_traits<char>_> *)__x,
                             (basic_string_view<char,_std::char_traits<char>_> *)__y);
          if (bVar2) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0056b15b;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
      if (bVar2) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
        ::table_locator(&local_b0);
        goto LAB_0056b15b;
      }
      bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,((string_view *)((long)__x + 8))->_M_len);
    } while (bVar2);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
    ::table_locator(&local_b0);
LAB_0056b15b:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               ::make_iterator((locator *)0x56b168);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = (Scope *)local_c0.pc_;
    local_e8 = local_c0.p_;
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
           *)0x56b1fa);
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffd90,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffd88);
    if (bVar2) {
      ppVar3 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_fffffffffffffd90);
      local_130 = &ppVar3->second;
      in_stack_00000008 = (ppVar3->second).defaultRule;
    }
  }
  if (in_stack_00000008 != (ConfigRule *)0x0) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(in_stack_00000008->useCell).name);
    if (!bVar2) {
      resolveConfigRule(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      return in_RDI;
    }
    in_stack_00000008->isUsed = true;
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                        *)0x56b2c9);
    if (bVar2) {
      psVar4 = std::optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
               ::operator*((optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                            *)0x56b2dc);
      local_140 = psVar4->_M_ptr;
      local_138 = (psVar4->_M_extent)._M_extent_value;
    }
  }
  local_1a0 = &local_130;
  this_01 = local_120;
  bVar2 = std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)0x56b34f);
  if (bVar2) {
    Scope::asSymbol(local_120);
    local_1f0 = Symbol::getDeclaringDefinition((Symbol *)in_stack_fffffffffffffd98);
    if (local_1f0 != (DefinitionSymbol *)0x0) {
      resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                ((anon_class_40_5_c3c3317d *)this_01,in_RSI);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>
                          *)0x56b49d);
      if (bVar2) {
        ppVar6 = std::optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>::
                 operator*((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>
                            *)0x56b4ad);
        (this_00->first).definition = (ppVar6->first).definition;
        (this_00->first).configRoot = (ppVar6->first).configRoot;
        (this_00->first).configRule = (ppVar6->first).configRule;
        uVar1 = *(undefined7 *)&ppVar6->field_0x19;
        this_00->second = ppVar6->second;
        *(undefined7 *)&this_00->field_0x19 = uVar1;
        return in_RDI;
      }
    }
  }
  else {
    local_1a8 = &local_140;
    local_1b0._M_current =
         (SourceLibrary **)
         std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffd88);
    local_1b8 = (SourceLibrary **)
                std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::end
                          ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)
                           in_stack_fffffffffffffd98);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffd90,
                              (__normal_iterator<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffd88), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                ::operator*(&local_1b0);
      local_1c0 = *ppSVar5;
      resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                ((anon_class_40_5_c3c3317d *)this_01,in_RSI);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>
                          *)0x56b3f3);
      if (bVar2) {
        ppVar6 = std::optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>::
                 operator*((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_>
                            *)0x56b406);
        (this_00->first).definition = (ppVar6->first).definition;
        (this_00->first).configRoot = (ppVar6->first).configRoot;
        (this_00->first).configRule = (ppVar6->first).configRule;
        uVar1 = *(undefined7 *)&ppVar6->field_0x19;
        this_00->second = ppVar6->second;
        *(undefined7 *)&this_00->field_0x19 = uVar1;
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::SourceLibrary_*const_*,_std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
      ::operator++(&local_1b0);
    }
  }
  memset(local_230,0,0x18);
  DefinitionLookupResult::DefinitionLookupResult(local_230);
  local_231 = false;
  std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>::pair<bool,_true>
            (this_00,local_230,&local_231);
  return in_RDI;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRules(
    std::string_view lookupName, const Scope& scope, const ResolvedConfig* parentConfig,
    const ConfigRule* rule, const std::vector<Symbol*>& defList) const {

    const ConfigBlockSymbol::CellOverride* cellOverride = nullptr;
    std::span<const SourceLibrary* const> liblist;
    if (parentConfig) {
        SLANG_ASSERT(!rule);
        liblist = parentConfig->liblist;

        auto& conf = parentConfig->useConfig;
        auto& overrides = conf.getCellOverrides();
        if (auto overrideIt = overrides.find(lookupName); overrideIt != overrides.end()) {
            cellOverride = &overrideIt->second;
            rule = cellOverride->defaultRule;
        }
    }

    if (rule) {
        if (auto& id = rule->useCell; !id.name.empty())
            return resolveConfigRule(scope, *rule);

        rule->isUsed = true;
        if (rule->liblist)
            liblist = *rule->liblist;
    }

    auto findDefWithOverride = [&](const SourceLibrary& targetLib)
        -> std::optional<std::pair<Compilation::DefinitionLookupResult, bool>> {
        // If we have a cell override that specifically targets
        // this lib then we should just return that directly.
        if (cellOverride) {
            if (auto it = cellOverride->specificLibRules.find(&targetLib);
                it != cellOverride->specificLibRules.end()) {
                return resolveConfigRule(scope, *it->second);
            }
        }

        // Otherwise try to find the def in our list.
        if (auto def = findDefByLib(defList, targetLib)) {
            return std::pair<Compilation::DefinitionLookupResult, bool>{{def, nullptr, rule},
                                                                        false};
        }
        return std::nullopt;
    };

    if (!liblist.empty()) {
        // This search is O(n^2) but both lists should be small
        // (or even just one element each) in basically all cases.
        for (auto lib : liblist) {
            if (auto result = findDefWithOverride(*lib))
                return *result;
        }
    }
    else if (auto parentDef = scope.asSymbol().getDeclaringDefinition()) {
        // Fall back to picking based on the parent instance's library.
        if (auto result = findDefWithOverride(parentDef->sourceLibrary))
            return *result;
    }

    return {{}, false};
}